

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O2

bool sb_switch_reserved_blocks(filemgr *file)

{
  uint uVar1;
  superblock *sb;
  sb_rsv_bmp *psVar2;
  uint8_t *__ptr;
  uint64_t uVar3;
  void *pvVar4;
  docio_object *pdVar5;
  bid_t bVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  sb = file->sb;
  psVar2 = sb->rsv_bmp;
  bVar7 = false;
  if (psVar2 != (sb_rsv_bmp *)0x0) {
    LOCK();
    bVar10 = (psVar2->status).super___atomic_base<unsigned_int>._M_i == 0xffff;
    if (bVar10) {
      (psVar2->status).super___atomic_base<unsigned_int>._M_i = 0;
    }
    UNLOCK();
    bVar7 = false;
    if (bVar10) {
      if (sb->bmp_doc_offset != (bid_t *)0x0) {
        lVar9 = 1;
        for (uVar8 = 0; uVar8 < sb->num_bmp_docs; uVar8 = uVar8 + 1) {
          uVar1 = *(uint *)((long)sb->bmp_docs + lVar9 * 8 + -8);
          filemgr_mark_stale(file,sb->bmp_doc_offset[uVar8],
                             (ulong)((uVar1 & 0xffff) + (uVar1 >> 0x10) +
                                    *(int *)(&(sb->bmp_docs->length).keylen + lVar9 * 4)) + 0x20);
          lVar9 = lVar9 + 7;
        }
        free(sb->bmp_doc_offset);
        free(sb->bmp_docs);
        sb->bmp_doc_offset = (bid_t *)0x0;
        sb->bmp_docs = (docio_object *)0x0;
      }
      filemgr_sync(file,false,(err_log_callback *)0x0);
      _free_bmp_idx(&sb->bmp_idx);
      sb_bmp_change_begin(sb);
      __ptr = sb->bmp_prev;
      sb->bmp_prev = (sb->bmp)._M_b._M_p;
      sb->bmp_prev_size = (sb->bmp_size).super___atomic_base<unsigned_long>._M_i;
      LOCK();
      (sb->bmp_revnum).super___atomic_base<unsigned_long>._M_i = psVar2->bmp_revnum;
      UNLOCK();
      LOCK();
      (sb->bmp_size).super___atomic_base<unsigned_long>._M_i = psVar2->bmp_size;
      UNLOCK();
      LOCK();
      (sb->bmp)._M_b._M_p = psVar2->bmp;
      UNLOCK();
      pvVar4 = (psVar2->bmp_idx).aux;
      (sb->bmp_idx).root = (psVar2->bmp_idx).root;
      (sb->bmp_idx).aux = pvVar4;
      pdVar5 = psVar2->bmp_docs;
      sb->bmp_doc_offset = psVar2->bmp_doc_offset;
      sb->bmp_docs = pdVar5;
      sb->num_bmp_docs = psVar2->num_bmp_docs;
      uVar3 = psVar2->num_free_blocks;
      sb->num_init_free_blocks = uVar3;
      sb->num_free_blocks = uVar3;
      LOCK();
      (sb->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i = psVar2->cur_alloc_bid;
      UNLOCK();
      bVar6 = psVar2->min_live_hdr_bid;
      sb->min_live_hdr_revnum = psVar2->min_live_hdr_revnum;
      sb->min_live_hdr_bid = bVar6;
      sb_bmp_change_end(sb);
      free(__ptr);
      free(sb->rsv_bmp);
      sb->rsv_bmp = (sb_rsv_bmp *)0x0;
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

bool sb_switch_reserved_blocks(struct filemgr *file)
{
    size_t i;
    struct superblock *sb = file->sb;
    struct sb_rsv_bmp *rsv = sb->rsv_bmp;

    // reserved block should exist
    if (!rsv) {
        return false;
    }
    // should be in a normal status
    if (!atomic_cas_uint32_t(&rsv->status, SB_RSV_READY, SB_RSV_VOID)) {
        return false;
    }
    // now status becomes 'VOID' so that rsv_bmp is not available.

    // mark stale previous system docs
    if (sb->bmp_doc_offset) {
        for (i=0; i<sb->num_bmp_docs; ++i) {
            filemgr_mark_stale(file, sb->bmp_doc_offset[i],
                _fdb_get_docsize(sb->bmp_docs[i].length));
        }

        free(sb->bmp_doc_offset);
        free(sb->bmp_docs);
        sb->bmp_doc_offset = NULL;
        sb->bmp_docs = NULL;
    }

    // should flush all dirty blocks in cache
    filemgr_sync(file, false, NULL);

    // free current bitmap idx
    _free_bmp_idx(&sb->bmp_idx);

    // temporarily keep current bitmap
    sb_bmp_change_begin(sb);
    uint8_t *old_prev_bmp = NULL;
    if (sb->bmp_prev) {
        old_prev_bmp = sb->bmp_prev;
    }
    sb->bmp_prev = sb->bmp;
    sb->bmp_prev_size = atomic_get_uint64_t(&sb->bmp_size);

    // copy all pointers from rsv to sb
    atomic_store(&sb->bmp_revnum, rsv->bmp_revnum);
    atomic_store_uint64_t(&sb->bmp_size, rsv->bmp_size);
    sb->bmp = rsv->bmp;
    sb->bmp_idx = rsv->bmp_idx;
    sb->bmp_doc_offset = rsv->bmp_doc_offset;
    sb->bmp_docs = rsv->bmp_docs;
    sb->num_bmp_docs = rsv->num_bmp_docs;
    sb->num_free_blocks = sb->num_init_free_blocks = rsv->num_free_blocks;
    atomic_store_uint64_t(&sb->cur_alloc_bid, rsv->cur_alloc_bid);
    sb->min_live_hdr_revnum = rsv->min_live_hdr_revnum;
    sb->min_live_hdr_bid = rsv->min_live_hdr_bid;
    sb_bmp_change_end(sb);

    free(old_prev_bmp);
    free(sb->rsv_bmp);
    sb->rsv_bmp = NULL;

    return true;
}